

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O3

bool __thiscall
binlog::SessionWriter::
addEvent<std::deque<int,std::allocator<int>>&,std::__cxx11::list<int,std::allocator<int>>&,std::vector<bool,std::allocator<bool>>&>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,
          deque<int,_std::allocator<int>_> *args,list<int,_std::allocator<int>_> *args_1,
          vector<bool,_std::allocator<bool>_> *args_2)

{
  ulong minQueueCapacity;
  QueueWriter *this_00;
  char **ppcVar1;
  _Elt_pointer piVar2;
  char *pcVar3;
  Queue *pQVar4;
  bool bVar5;
  long lVar6;
  size_t sVar7;
  int *piVar8;
  _Elt_pointer piVar9;
  _List_node_base *p_Var10;
  int iVar11;
  _Map_pointer ppiVar12;
  _Elt_pointer piVar13;
  deque<int,_std::allocator<int>_> *__range3;
  long lVar14;
  const_iterator __end0;
  size_t sizes [5];
  long local_58 [5];
  
  local_58[0] = 8;
  local_58[1] = 8;
  piVar9 = (args->super__Deque_base<int,_std::allocator<int>_>)._M_impl.super__Deque_impl_data.
           _M_start._M_cur;
  piVar2 = (args->super__Deque_base<int,_std::allocator<int>_>)._M_impl.super__Deque_impl_data.
           _M_finish._M_cur;
  if (piVar9 == piVar2) {
    local_58[2] = 4;
  }
  else {
    piVar13 = (args->super__Deque_base<int,_std::allocator<int>_>)._M_impl.super__Deque_impl_data.
              _M_start._M_last;
    ppiVar12 = (args->super__Deque_base<int,_std::allocator<int>_>)._M_impl.super__Deque_impl_data.
               _M_start._M_node;
    local_58[2] = 4;
    do {
      piVar9 = piVar9 + 1;
      if (piVar9 == piVar13) {
        piVar9 = ppiVar12[1];
        ppiVar12 = ppiVar12 + 1;
        piVar13 = piVar9 + 0x80;
      }
      local_58[2] = local_58[2] + 4;
    } while (piVar9 != piVar2);
  }
  local_58[3] = 0;
  p_Var10 = (_List_node_base *)args_1;
  do {
    p_Var10 = (((_List_base<int,_std::allocator<int>_> *)&p_Var10->_M_next)->_M_impl)._M_node.
              super__List_node_base._M_next;
    local_58[3] = local_58[3] + 4;
  } while (p_Var10 != (_List_node_base *)args_1);
  local_58[4] = mserialize::detail::
                BuiltinSerializer<std::vector<bool,_std::allocator<bool>_>,_void>::serialized_size
                          (args_2);
  lVar14 = 0;
  lVar6 = 0;
  do {
    lVar14 = lVar14 + *(long *)((long)local_58 + lVar6);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x28);
  minQueueCapacity = lVar14 + 4;
  this_00 = &this->_qw;
  if (((((ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < minQueueCapacity) &&
       (sVar7 = detail::QueueWriter::maximizeWriteCapacity(this_00), sVar7 < minQueueCapacity)) &&
      (replaceChannel(this,minQueueCapacity),
      (ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < minQueueCapacity)) &&
     (sVar7 = detail::QueueWriter::maximizeWriteCapacity(this_00), sVar7 < minQueueCapacity)) {
    bVar5 = false;
  }
  else {
    *(int *)(this->_qw)._writePos = (int)lVar14;
    pcVar3 = (this->_qw)._writePos;
    (this->_qw)._writePos = pcVar3 + 4;
    *(uint64_t *)(pcVar3 + 4) = eventSourceId;
    pcVar3 = (this->_qw)._writePos;
    (this->_qw)._writePos = pcVar3 + 8;
    *(uint64_t *)(pcVar3 + 8) = clock;
    ppcVar1 = &(this->_qw)._writePos;
    *ppcVar1 = *ppcVar1 + 8;
    mserialize::detail::BuiltinSerializer<std::deque<int,_std::allocator<int>_>,_void>::
    serialize<binlog::detail::QueueWriter>(args,this_00);
    *(int *)(this->_qw)._writePos =
         (int)(args_1->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node._M_size;
    piVar8 = (int *)((this->_qw)._writePos + 4);
    (this->_qw)._writePos = (char *)piVar8;
    for (p_Var10 = (args_1->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node.
                   super__List_node_base._M_next; p_Var10 != (_List_node_base *)args_1;
        p_Var10 = (((_List_base<int,_std::allocator<int>_> *)&p_Var10->_M_next)->_M_impl)._M_node.
                  super__List_node_base._M_next) {
      *piVar8 = *(int *)&p_Var10[1]._M_next;
      piVar8 = (int *)((this->_qw)._writePos + 4);
      (this->_qw)._writePos = (char *)piVar8;
    }
    iVar11 = (*(int *)&(args_2->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
             *(int *)&(args_2->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
             (args_2->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset;
    *piVar8 = iVar11;
    ppcVar1 = &(this->_qw)._writePos;
    *ppcVar1 = *ppcVar1 + 4;
    mserialize::detail::BuiltinSerializer<std::vector<bool,_std::allocator<bool>_>,_void>::
    serialize_elems<binlog::detail::QueueWriter>(args_2,iVar11,this_00);
    pQVar4 = (this->_qw)._queue;
    (pQVar4->writeIndex).super___atomic_base<unsigned_long>._M_i =
         (long)(this->_qw)._writePos - (long)pQVar4->buffer;
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}